

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

size_t appendEscapedSubstring(char *str,size_t i)

{
  char v;
  char cVar1;
  char *pcVar2;
  
LAB_0010e50e:
  while( true ) {
    while( true ) {
      while( true ) {
        pcVar2 = str + 1;
        cVar1 = *str;
        if (cVar1 == '\0') {
          return i;
        }
        str = pcVar2;
        if (cVar1 == '\t') goto LAB_0010e54d;
        if (cVar1 != '\n') break;
        if (i < 0x100) {
          cVar1 = 'n';
          goto LAB_0010e563;
        }
      }
      if (cVar1 != '\r') break;
      if (i < 0x100) {
        cVar1 = 'r';
        goto LAB_0010e563;
      }
    }
    if (((cVar1 != '\"') && (cVar1 != '{')) && (cVar1 != '\\')) break;
    if (i < 0x100) goto LAB_0010e563;
  }
  goto LAB_0010e56a;
LAB_0010e54d:
  if (i < 0x100) {
    cVar1 = 't';
LAB_0010e563:
    yylval.symName[i] = '\\';
    i = i + 1;
LAB_0010e56a:
    if (i < 0x100) {
      yylval.symName[i] = cVar1;
      i = i + 1;
    }
  }
  goto LAB_0010e50e;
}

Assistant:

static size_t appendEscapedSubstring(char const *str, size_t i)
{
	// Copy one extra to flag overflow
	while (*str) {
		char c = *str++;

		// Escape characters that need escaping
		switch (c) {
		case '\\':
		case '"':
		case '{':
			append_yylval_string('\\');
			break;
		case '\n':
			append_yylval_string('\\');
			c = 'n';
			break;
		case '\r':
			append_yylval_string('\\');
			c = 'r';
			break;
		case '\t':
			append_yylval_string('\\');
			c = 't';
			break;
		}

		append_yylval_string(c);
	}

	return i;
}